

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

String * __thiscall
kj::_::encodeCEscapeImpl
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_unsigned_char> bytes,bool isBinary)

{
  size_t capacity;
  ArrayPtr<const_char> AVar1;
  Array<char> local_138;
  int local_120;
  char local_119;
  ArrayPtr<const_char> local_118;
  ArrayPtr<const_char> local_108;
  ArrayPtr<const_char> local_f8;
  ArrayPtr<const_char> local_e8;
  ArrayPtr<const_char> local_d8;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  byte local_71;
  byte *pbStack_70;
  byte b;
  uchar *__end2;
  byte *local_58;
  uchar *__begin2;
  ArrayPtr<const_unsigned_char> *__range2;
  Vector<char> escaped;
  undefined1 auStack_20 [7];
  bool isBinary_local;
  ArrayPtr<const_unsigned_char> bytes_local;
  
  bytes_local.ptr = bytes.ptr;
  escaped.builder.disposer._7_1_ = (byte)bytes.size_ & 1;
  _auStack_20 = this;
  bytes_local.size_ = (size_t)__return_storage_ptr__;
  capacity = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)auStack_20);
  Vector<char>::Vector((Vector<char> *)&__range2,capacity);
  __begin2 = (uchar *)auStack_20;
  local_58 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)auStack_20);
  pbStack_70 = ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)__begin2);
  for (; local_58 != pbStack_70; local_58 = local_58 + 1) {
    local_71 = *local_58;
    switch(local_71) {
    case 7:
      AVar1 = (ArrayPtr<const_char>)operator____kj("\\a",2);
      local_88 = AVar1;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range2,(StringPtr *)&local_88);
      break;
    case 8:
      AVar1 = (ArrayPtr<const_char>)operator____kj("\\b",2);
      local_98 = AVar1;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range2,(StringPtr *)&local_98);
      break;
    case 9:
      AVar1 = (ArrayPtr<const_char>)operator____kj("\\t",2);
      local_d8 = AVar1;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range2,(StringPtr *)&local_d8);
      break;
    case 10:
      AVar1 = (ArrayPtr<const_char>)operator____kj("\\n",2);
      local_b8 = AVar1;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range2,(StringPtr *)&local_b8);
      break;
    case 0xb:
      AVar1 = (ArrayPtr<const_char>)operator____kj("\\v",2);
      local_e8 = AVar1;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range2,(StringPtr *)&local_e8);
      break;
    case 0xc:
      AVar1 = (ArrayPtr<const_char>)operator____kj("\\f",2);
      local_a8 = AVar1;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range2,(StringPtr *)&local_a8);
      break;
    case 0xd:
      AVar1 = (ArrayPtr<const_char>)operator____kj("\\r",2);
      local_c8 = AVar1;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range2,(StringPtr *)&local_c8);
      break;
    default:
      if (((local_71 < 0x20) || (local_71 == 0x7f)) ||
         (((escaped.builder.disposer._7_1_ & 1) != 0 && (0x7f < local_71)))) {
        local_119 = '\\';
        Vector<char>::add<char>((Vector<char> *)&__range2,&local_119);
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&__range2,"0123456789abcdef" + (local_71 >> 6));
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&__range2,"0123456789abcdef" + (local_71 >> 3 & 7));
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&__range2,"0123456789abcdef" + (local_71 & 7));
      }
      else {
        Vector<char>::add<unsigned_char&>((Vector<char> *)&__range2,&local_71);
      }
      break;
    case 0x22:
      AVar1 = (ArrayPtr<const_char>)operator____kj("\\\"",2);
      local_108 = AVar1;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range2,(StringPtr *)&local_108);
      break;
    case 0x27:
      AVar1 = (ArrayPtr<const_char>)operator____kj("\\\'",2);
      local_f8 = AVar1;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range2,(StringPtr *)&local_f8);
      break;
    case 0x5c:
      AVar1 = (ArrayPtr<const_char>)operator____kj("\\\\",2);
      local_118 = AVar1;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&__range2,(StringPtr *)&local_118);
    }
  }
  local_120 = 0;
  Vector<char>::add<int>((Vector<char> *)&__range2,&local_120);
  Vector<char>::releaseAsArray(&local_138,(Vector<char> *)&__range2);
  String::String(__return_storage_ptr__,&local_138);
  Array<char>::~Array(&local_138);
  Vector<char>::~Vector((Vector<char> *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

String encodeCEscapeImpl(ArrayPtr<const byte> bytes, bool isBinary) {
  Vector<char> escaped(bytes.size());

  for (byte b: bytes) {
    switch (b) {
      case '\a': escaped.addAll("\\a"_kj); break;
      case '\b': escaped.addAll("\\b"_kj); break;
      case '\f': escaped.addAll("\\f"_kj); break;
      case '\n': escaped.addAll("\\n"_kj); break;
      case '\r': escaped.addAll("\\r"_kj); break;
      case '\t': escaped.addAll("\\t"_kj); break;
      case '\v': escaped.addAll("\\v"_kj); break;
      case '\'': escaped.addAll("\\\'"_kj); break;
      case '\"': escaped.addAll("\\\""_kj); break;
      case '\\': escaped.addAll("\\\\"_kj); break;
      default:
        if (b < 0x20 || b == 0x7f || (isBinary && b > 0x7f)) {
          // Use octal escape, not hex, because hex escapes technically have no length limit and
          // so can create ambiguity with subsequent characters.
          escaped.add('\\');
          escaped.add(HEX_DIGITS[b / 64]);
          escaped.add(HEX_DIGITS[(b / 8) % 8]);
          escaped.add(HEX_DIGITS[b % 8]);
        } else {
          escaped.add(b);
        }
        break;
    }
  }

  escaped.add(0);
  return String(escaped.releaseAsArray());
}